

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O1

QList<int> *
QFontDatabase::pointSizes(QList<int> *__return_storage_ptr__,QString *family,QString *styleName)

{
  long lVar1;
  ushort uVar2;
  QtFontFoundry *this;
  double dVar3;
  long lVar4;
  Data *pDVar5;
  int *piVar6;
  qsizetype qVar7;
  char cVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Type *pTVar12;
  QtFontFamily *pQVar13;
  QtFontStyle *pQVar14;
  undefined4 extraout_var_01;
  iterator iVar15;
  iterator iVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  long in_FS_OFFSET;
  QDeadlineTimer QVar23;
  QList<int> local_98;
  QString local_78;
  QString local_58;
  int local_40;
  Key local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar10 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0xd])();
  cVar8 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar10) + 0x80))
                    ((long *)CONCAT44(extraout_var,iVar10));
  if (cVar8 != '\0') {
    iVar10 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0xd])();
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar10) + 0x88))
                (__return_storage_ptr__,(long *)CONCAT44(extraout_var_00,iVar10));
      return __return_storage_ptr__;
    }
    goto LAB_0049daab;
  }
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_58.d.size = 0;
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (char16_t *)0x0;
  local_78.d.size = 0;
  parseFontName(family,&local_78,&local_58);
  pTVar12 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::
            operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
                        *)family);
  if (pTVar12 != (Type *)0x0) {
    QVar23.t2 = 0xffffffff;
    QVar23.type = 0x7fffffff;
    QVar23.t1 = (qint64)pTVar12;
    QRecursiveMutex::tryLock(QVar23);
  }
  QFontDatabasePrivate::ensureFontDatabase();
  local_98.d.d = (Data *)0x0;
  local_98.d.ptr = (int *)0x0;
  local_98.d.size = 0;
  uVar22 = 2;
  pQVar13 = QFontDatabasePrivate::family
                      (&QFontDatabasePrivate::instance::instance,&local_58,EnsurePopulated);
  if (pQVar13 == (QtFontFamily *)0x0) {
LAB_0049d9e5:
    qVar7 = local_98.d.size;
    piVar6 = local_98.d.ptr;
    pDVar5 = local_98.d.d;
    local_98.d.d = (Data *)0x0;
    local_98.d.ptr = (int *)0x0;
    (__return_storage_ptr__->d).d = pDVar5;
    (__return_storage_ptr__->d).ptr = piVar6;
    local_98.d.size = 0;
    (__return_storage_ptr__->d).size = qVar7;
  }
  else {
    iVar10 = qt_defaultDpiY();
    local_3c = (Key)0xaaaaaaaa;
    QtFontStyle::Key::Key(&local_3c,styleName);
    if (pQVar13->count < 1) {
      bVar9 = false;
    }
    else {
      lVar21 = 0;
      bVar9 = false;
      do {
        this = pQVar13->foundries[lVar21];
        if (local_78.d.size == 0) {
LAB_0049d802:
          pQVar14 = QtFontFoundry::style(this,&local_3c,styleName,false);
          if (pQVar14 == (QtFontStyle *)0x0) {
            uVar22 = 4;
          }
          else if ((pQVar14->field_0x4 & 2) == 0) {
            uVar22 = 0;
            if (3 < *(int *)&pQVar14->field_0x4) {
              lVar19 = 0;
              do {
                lVar18 = lVar19 * 0x10;
                uVar2 = *(ushort *)&pQVar14->pixelSizes[lVar19].field_0x8;
                if ((uVar2 != 0) && (uVar2 != 0xffff)) {
                  dVar3 = ((double)uVar2 * 72.0) / (double)iVar10;
                  iVar11 = (int)((double)((ulong)dVar3 & 0x8000000000000000 | 0x3fe0000000000000) +
                                dVar3);
                  if (local_98.d.size == 0) {
LAB_0049d8d3:
                    lVar18 = -1;
                  }
                  else {
                    lVar20 = -4;
                    do {
                      lVar1 = local_98.d.size * -4 + lVar20;
                      if (lVar1 == -4) goto LAB_0049d8cd;
                      lVar18 = lVar20 + 4;
                      lVar4 = lVar20 + 4;
                      lVar20 = lVar18;
                    } while (*(int *)((long)local_98.d.ptr + lVar4) != iVar11);
                    lVar18 = lVar18 >> 2;
LAB_0049d8cd:
                    if (lVar1 == -4) goto LAB_0049d8d3;
                  }
                  if (lVar18 == -1) {
                    local_40 = iVar11;
                    QtPrivate::QPodArrayOps<int>::emplace<int&>
                              ((QPodArrayOps<int> *)&local_98,local_98.d.size,&local_40);
                    QList<int>::end(&local_98);
                  }
                }
                uVar22 = 0;
                lVar19 = lVar19 + 1;
              } while (lVar19 < *(int *)&pQVar14->field_0x4 >> 2);
            }
          }
          else {
            bVar9 = true;
            uVar22 = 5;
          }
        }
        else {
          uVar22 = 0;
          iVar11 = QString::compare(&this->name,(CaseSensitivity)&local_78);
          if (iVar11 == 0) goto LAB_0049d802;
        }
        if ((uVar22 & 3) != 0) goto LAB_0049d966;
        lVar21 = lVar21 + 1;
      } while (lVar21 < pQVar13->count);
      uVar22 = 2;
    }
LAB_0049d966:
    if ((uVar22 == 5) || (uVar22 == 2)) {
      if (!bVar9) {
        iVar15 = QList<int>::begin(&local_98);
        iVar16 = QList<int>::end(&local_98);
        if (iVar15.i != iVar16.i) {
          uVar17 = (long)iVar16.i - (long)iVar15.i >> 2;
          lVar21 = 0x3f;
          if (uVar17 != 0) {
            for (; uVar17 >> lVar21 == 0; lVar21 = lVar21 + -1) {
            }
          }
          std::__introsort_loop<QList<int>::iterator,long_long,__gnu_cxx::__ops::_Iter_less_iter>
                    (iVar15.i,iVar16.i,((uint)lVar21 ^ 0x3f) * 2 ^ 0x7e);
          std::__final_insertion_sort<QList<int>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
                    (iVar15.i,iVar16.i);
        }
        goto LAB_0049d9e5;
      }
      iVar10 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0xd])();
      (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar10) + 0x88))
                (__return_storage_ptr__,(long *)CONCAT44(extraout_var_01,iVar10));
    }
  }
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,4,0x10);
    }
  }
  if (pTVar12 != (Type *)0x0) {
    QRecursiveMutex::unlock();
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0049daab:
  __stack_chk_fail();
}

Assistant:

QList<int> QFontDatabase::pointSizes(const QString &family,
                                     const QString &styleName)
{
    if (QGuiApplicationPrivate::platformIntegration()->fontDatabase()->fontsAlwaysScalable())
        return standardSizes();

    bool smoothScalable = false;
    QString familyName, foundryName;
    parseFontName(family, foundryName, familyName);

    QMutexLocker locker(fontDatabaseMutex());
    QFontDatabasePrivate *d = QFontDatabasePrivate::ensureFontDatabase();

    QList<int> sizes;

    QtFontFamily *fam = d->family(familyName);
    if (!fam) return sizes;


    const int dpi = qt_defaultDpiY(); // embedded

    QtFontStyle::Key styleKey(styleName);
    for (int j = 0; j < fam->count; j++) {
        QtFontFoundry *foundry = fam->foundries[j];
        if (foundryName.isEmpty() || foundry->name.compare(foundryName, Qt::CaseInsensitive) == 0) {
            QtFontStyle *style = foundry->style(styleKey, styleName);
            if (!style) continue;

            if (style->smoothScalable) {
                smoothScalable = true;
                goto end;
            }
            for (int l = 0; l < style->count; l++) {
                const QtFontSize *size = style->pixelSizes + l;

                if (size->pixelSize != 0 && size->pixelSize != SMOOTH_SCALABLE) {
                    const int pointSize = qRound(size->pixelSize * 72.0 / dpi);
                    if (! sizes.contains(pointSize))
                        sizes.append(pointSize);
                }
            }
        }
    }
 end:
    if (smoothScalable)
        return standardSizes();

    std::sort(sizes.begin(), sizes.end());
    return sizes;
}